

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O2

REF_STATUS ref_part_cad_data(REF_GRID ref_grid,char *filename)

{
  REF_MPI ref_mpi;
  REF_GEOM pRVar1;
  int iVar2;
  uint uVar3;
  REF_STATUS RVar4;
  size_t sVar5;
  FILE *__stream;
  REF_BYTE *pRVar6;
  undefined8 uVar7;
  char *pcVar8;
  size_t __size;
  REF_BOOL available;
  REF_INT version;
  REF_INT dim;
  REF_FILEPOS next_position;
  REF_FILEPOS key_pos [156];
  
  ref_mpi = ref_grid->mpi;
  pRVar1 = ref_grid->geom;
  version = -1;
  dim = -1;
  sVar5 = strlen(filename);
  iVar2 = strcmp(filename + (sVar5 - 6),".meshb");
  if (iVar2 == 0) {
    if (ref_mpi->id == 0) {
      RVar4 = ref_import_meshb_header(filename,&version,key_pos);
      if (RVar4 != 0) {
        pcVar8 = "header";
        uVar7 = 0x363;
        goto LAB_001eb2a7;
      }
      __stream = fopen(filename,"r");
      if (__stream == (FILE *)0x0) {
        printf("unable to open %s\n",filename);
        pcVar8 = "unable to open file";
        uVar7 = 0x368;
        goto LAB_001eb4d3;
      }
      RVar4 = ref_import_meshb_jump((FILE *)__stream,version,key_pos,3,&available,&next_position);
      if (RVar4 != 0) {
        pcVar8 = "jump";
        uVar7 = 0x36b;
        goto LAB_001eb2a7;
      }
      if (available == 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x36c,"ref_part_cad_data","meshb missing dimension");
        return 1;
      }
      sVar5 = fread(&dim,4,1,__stream);
      if (sVar5 != 1) {
        pcVar8 = "dim";
        uVar7 = 0x36d;
        __size = 1;
        goto LAB_001eb611;
      }
      if (ref_grid->mpi->id == 0) {
        RVar4 = ref_import_meshb_jump
                          ((FILE *)__stream,version,key_pos,0x7e,&available,&next_position);
        if (RVar4 != 0) {
          pcVar8 = "jump";
          uVar7 = 0x375;
          goto LAB_001eb2a7;
        }
        if (available != 0) {
          RVar4 = ref_part_meshb_size((FILE *)__stream,version,&pRVar1->cad_data_size);
          if (RVar4 != 0) {
            pcVar8 = "cad data size";
            RVar4 = 1;
            uVar7 = 0x379;
            goto LAB_001eb2a7;
          }
          free(pRVar1->cad_data);
          __size = pRVar1->cad_data_size;
          pRVar6 = (REF_BYTE *)malloc(__size);
          pRVar1->cad_data = pRVar6;
          if (pRVar6 == (REF_BYTE *)0x0) {
            pcVar8 = "malloc ref_geom_cad_data(ref_geom) of REF_BYTE NULL";
            uVar7 = 0x37f;
            goto LAB_001eb4d3;
          }
          sVar5 = fread(pRVar6,1,__size,__stream);
          if (__size != sVar5) {
            pcVar8 = "cad_data";
            uVar7 = 899;
LAB_001eb611:
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   uVar7,"ref_part_cad_data",pcVar8,__size,sVar5);
            return 1;
          }
          sVar5 = ftello(__stream);
          if (next_position != sVar5) {
            pcVar8 = "end location";
            uVar7 = 900;
            __size = next_position;
            goto LAB_001eb611;
          }
        }
      }
    }
    else {
      __stream = (FILE *)0x0;
    }
    uVar3 = ref_mpi_bcast(ref_mpi,&available,1,1);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x387,
             "ref_part_cad_data",(ulong)uVar3,"bcast");
      return uVar3;
    }
    if (available == 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x389,
             "ref_part_cad_data","GmfByteFlow keyword for cad data missing");
      return 1;
    }
    RVar4 = ref_mpi_bcast(ref_mpi,&pRVar1->cad_data_size,1,1);
    if (RVar4 == 0) {
      pRVar6 = pRVar1->cad_data;
      if (ref_grid->mpi->id == 0) {
        sVar5 = pRVar1->cad_data_size;
      }
      else {
        free(pRVar6);
        sVar5 = pRVar1->cad_data_size;
        pRVar6 = (REF_BYTE *)malloc(sVar5);
        pRVar1->cad_data = pRVar6;
        if (pRVar6 == (REF_BYTE *)0x0) {
          pcVar8 = "malloc ref_geom_cad_data(ref_geom) of REF_BYTE NULL";
          uVar7 = 0x393;
LAB_001eb4d3:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 uVar7,"ref_part_cad_data",pcVar8);
          return 2;
        }
      }
      RVar4 = ref_mpi_bcast(ref_mpi,pRVar6,(REF_INT)sVar5,4);
      if (RVar4 == 0) {
        if (ref_grid->mpi->id == 0) {
          fclose(__stream);
          return 0;
        }
        return 0;
      }
      pcVar8 = "bcast";
      uVar7 = 0x397;
    }
    else {
      pcVar8 = "bcast";
      uVar7 = 0x38e;
    }
  }
  else {
    pcVar8 = "expected .meshb extension";
    RVar4 = 3;
    uVar7 = 0x35f;
  }
LAB_001eb2a7:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar7,
         "ref_part_cad_data",RVar4,pcVar8);
  return RVar4;
}

Assistant:

REF_FCN REF_STATUS ref_part_cad_data(REF_GRID ref_grid, const char *filename) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  FILE *file;
  REF_INT version = REF_EMPTY, dim = REF_EMPTY;
  REF_BOOL available;
  REF_FILEPOS next_position;
  REF_FILEPOS key_pos[REF_IMPORT_MESHB_LAST_KEYWORD];
  REF_INT cad_data_keyword;
  REF_BOOL verbose = REF_FALSE;
  size_t end_of_string;

  end_of_string = strlen(filename);

  if (strcmp(&filename[end_of_string - 6], ".meshb") != 0)
    RSS(REF_INVALID, "expected .meshb extension");

  file = NULL;
  if (ref_mpi_once(ref_mpi)) {
    RSS(ref_import_meshb_header(filename, &version, key_pos), "header");
    if (verbose) printf("meshb version %d\n", version);
    if (verbose) printf("open %s\n", filename);
    file = fopen(filename, "r");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
    RSS(ref_import_meshb_jump(file, version, key_pos, 3, &available,
                              &next_position),
        "jump");
    RAS(available, "meshb missing dimension");
    REIS(1, fread((unsigned char *)&dim, 4, 1, file), "dim");
    if (verbose) printf("meshb dim %d\n", dim);
  }

  if (ref_grid_once(ref_grid)) {
    cad_data_keyword = 126; /* GmfByteFlow */
    RSS(ref_import_meshb_jump(file, version, key_pos, cad_data_keyword,
                              &available, &next_position),
        "jump");
    if (available) {
      RSS(ref_part_meshb_size(file, version,
                              &(ref_geom_cad_data_size(ref_geom))),
          "cad data size");
      if (verbose)
        printf("cad_data_size %ld\n", (long)ref_geom_cad_data_size(ref_geom));
      /* safe non-NULL free, if already allocated, to prevent mem leaks */
      ref_free(ref_geom_cad_data(ref_geom));
      ref_malloc_size_t(ref_geom_cad_data(ref_geom),
                        ref_geom_cad_data_size(ref_geom), REF_BYTE);
      REIS(ref_geom_cad_data_size(ref_geom),
           fread(ref_geom_cad_data(ref_geom), sizeof(REF_BYTE),
                 (size_t)ref_geom_cad_data_size(ref_geom), file),
           "cad_data");
      REIS(next_position, ftello(file), "end location");
    }
  }
  RSS(ref_mpi_bcast(ref_mpi, &available, 1, REF_INT_TYPE), "bcast");

  RAS(available, "GmfByteFlow keyword for cad data missing");

  if (available) {
    RSS(ref_mpi_bcast(ref_mpi, &ref_geom_cad_data_size(ref_geom), 1,
                      REF_INT_TYPE),
        "bcast");
    if (!ref_grid_once(ref_grid)) {
      /* safe non-NULL free, if already allocated, to prevent mem leaks */
      ref_free(ref_geom_cad_data(ref_geom));
      ref_malloc_size_t(ref_geom_cad_data(ref_geom),
                        ref_geom_cad_data_size(ref_geom), REF_BYTE);
    }
    RSS(ref_mpi_bcast(ref_mpi, ref_geom_cad_data(ref_geom),
                      (REF_INT)ref_geom_cad_data_size(ref_geom), REF_BYTE_TYPE),
        "bcast");
  }

  if (ref_grid_once(ref_grid)) {
    fclose(file);
  }

  return REF_SUCCESS;
}